

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobject.cpp
# Opt level: O1

void __thiscall DObject::~DObject(DObject *this)

{
  PClass *this_00;
  DObject *pDVar1;
  DObject **ppDVar2;
  DObject *pDVar3;
  
  this->_vptr_DObject = (_func_int **)&PTR_StaticType_006f6d50;
  if (PClass::bShutdown == false) {
    if (this->Class == (PClass *)0x0) {
      this->Class = RegistrationInfo.MyClass;
    }
    this_00 = this->Class;
    if ((this->ObjectFlags & 0x40) == 0) {
      if (-1 < (char)this->ObjectFlags) {
        Printf("Warning: \'%s\' is freed outside the GC process.\n");
      }
      StaticPointerSubstitution(this,(DObject *)0x0,false);
      ppDVar2 = &GC::Root;
      if (GC::Root != (DObject *)0x0) {
        pDVar1 = GC::Root;
        if (GC::Root != this) {
          do {
            pDVar3 = pDVar1;
            pDVar1 = pDVar3->ObjNext;
            if (pDVar1 == (DObject *)0x0) goto LAB_00375e95;
          } while (pDVar1 != this);
          ppDVar2 = &pDVar3->ObjNext;
        }
        *ppDVar2 = this->ObjNext;
        if (&this->ObjNext == GC::SweepPos) {
          GC::SweepPos = ppDVar2;
        }
      }
LAB_00375e95:
      ppDVar2 = &GC::Gray;
      if (GC::Gray != (DObject *)0x0 && (this->ObjectFlags & 7) == 0) {
        pDVar1 = GC::Gray;
        if (GC::Gray != this) {
          do {
            pDVar3 = pDVar1;
            pDVar1 = pDVar3->GCNext;
            if (pDVar1 == (DObject *)0x0) goto LAB_00375ed3;
          } while (pDVar1 != this);
          ppDVar2 = &pDVar3->GCNext;
        }
        *ppDVar2 = this->GCNext;
      }
    }
LAB_00375ed3:
    if (this_00 != (PClass *)0x0) {
      PClass::DestroySpecials(this_00,this);
    }
  }
  return;
}

Assistant:

DObject::~DObject ()
{
	if (!PClass::bShutdown)
	{
		PClass *type = GetClass();
		if (!(ObjectFlags & OF_Cleanup) && !PClass::bShutdown)
		{
			DObject **probe;

			if (!(ObjectFlags & OF_YesReallyDelete))
			{
				Printf("Warning: '%s' is freed outside the GC process.\n",
					type != NULL ? type->TypeName.GetChars() : "==some object==");
			}

			// Find all pointers that reference this object and NULL them.
			StaticPointerSubstitution(this, NULL);

			// Now unlink this object from the GC list.
			for (probe = &GC::Root; *probe != NULL; probe = &((*probe)->ObjNext))
			{
				if (*probe == this)
				{
					*probe = ObjNext;
					if (&ObjNext == GC::SweepPos)
					{
						GC::SweepPos = probe;
					}
					break;
				}
			}

			// If it's gray, also unlink it from the gray list.
			if (this->IsGray())
			{
				for (probe = &GC::Gray; *probe != NULL; probe = &((*probe)->GCNext))
				{
					if (*probe == this)
					{
						*probe = GCNext;
						break;
					}
				}
			}
		}
		
		if (nullptr != type)
		{
			type->DestroySpecials(this);
		}
	}
}